

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O2

void simple_motion_search_prune_part_features
               (AV1_COMP *cpi,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_tree,int mi_row,int mi_col,
               BLOCK_SIZE bsize,float *features,int features_to_get)

{
  SIMPLE_MOTION_DATA_TREE *sms_tree_00;
  long lVar1;
  MB_MODE_INFO *pMVar2;
  MB_MODE_INFO *pMVar3;
  BLOCK_SIZE BVar4;
  int16_t iVar5;
  int mi_ext_col;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  undefined7 in_register_00000089;
  byte bVar12;
  uint uVar13;
  byte bVar14;
  uint *puVar15;
  int r_idx;
  long lVar16;
  ulong uVar17;
  int sub_idx;
  uint uVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  uint *in_stack_ffffffffffffff78;
  int ref_list [1];
  ulong local_78;
  uint local_58;
  uint local_50;
  
  uVar9 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  bVar14 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar9];
  ref_list[0] = 7;
  if ((cpi->rc).is_src_frame_alt_ref == 0) {
    ref_list[0] = 1;
  }
  bVar12 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar9];
  uVar13 = (uint)bsize;
  if (((features_to_get & 1U) != 0) && (sms_tree->sms_none_valid == 0)) {
    simple_motion_search_get_best_ref
              (cpi,x,sms_tree,mi_row,mi_col,bsize,ref_list,1,(int)sms_tree + 0x48,
               (int)sms_tree + 0x4c,in_stack_ffffffffffffff78,(uint *)CONCAT44(ref_list[0],uVar13));
    sms_tree->sms_none_valid = 1;
  }
  local_50 = (uint)bVar12;
  if ((features_to_get & 2U) != 0) {
    BVar4 = get_partition_subsize(bsize,'\x03');
    for (uVar17 = 0; uVar17 != 4; uVar17 = uVar17 + 1) {
      sms_tree_00 = sms_tree->split[uVar17];
      if (sms_tree_00->sms_none_valid == 0) {
        uVar18 = 0;
        if ((uVar17 & 1) != 0) {
          uVar18 = (uint)(bVar14 >> 1);
        }
        simple_motion_search_get_best_ref
                  (cpi,x,sms_tree_00,(((uint)(uVar17 >> 1) & 0x7fffffff) * local_50 >> 1) + mi_row,
                   uVar18 + mi_col,BVar4,ref_list,1,(int)sms_tree_00 + 0x48,(int)sms_tree_00 + 0x4c,
                   in_stack_ffffffffffffff78,(uint *)CONCAT44(ref_list[0],uVar13));
        sms_tree_00->sms_none_valid = 1;
      }
    }
  }
  if (((features_to_get & 4U) != 0) && (sms_tree->sms_rect_valid == 0)) {
    BVar4 = get_partition_subsize(bsize,'\x01');
    puVar15 = sms_tree->sms_rect_feat + 1;
    lVar16 = 2;
    uVar18 = 0;
    while (bVar19 = lVar16 != 0, lVar16 = lVar16 + -1, bVar19) {
      simple_motion_search_get_best_ref
                (cpi,x,sms_tree,(uVar18 >> 1) + mi_row,mi_col,BVar4,ref_list,0,(int)puVar15 + -4,
                 (int)puVar15,in_stack_ffffffffffffff78,(uint *)CONCAT44(ref_list[0],uVar13));
      puVar15 = puVar15 + 2;
      uVar18 = uVar18 + local_50;
    }
    BVar4 = get_partition_subsize(bsize,'\x02');
    puVar15 = sms_tree->sms_rect_feat + 5;
    lVar16 = 2;
    uVar17 = 0;
    while (bVar19 = lVar16 != 0, lVar16 = lVar16 + -1, bVar19) {
      simple_motion_search_get_best_ref
                (cpi,x,sms_tree,mi_row,(int)(uVar17 >> 1) + mi_col,BVar4,ref_list,0,
                 (int)puVar15 + -4,(int)puVar15,in_stack_ffffffffffffff78,
                 (uint *)CONCAT44(ref_list[0],uVar13));
      puVar15 = puVar15 + 2;
      local_58 = (uint)bVar14;
      uVar17 = (ulong)((int)uVar17 + local_58);
    }
    sms_tree->sms_rect_valid = 1;
  }
  if (features != (float *)0x0) {
    local_78 = 0;
    if ((features_to_get & 1U) != 0) {
      local_78 = 2;
      for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
        fVar20 = log1pf((float)sms_tree->sms_none_feat[lVar16]);
        features[lVar16] = fVar20;
      }
    }
    if ((features_to_get & 2U) != 0) {
      for (lVar16 = 0; lVar16 != 8; lVar16 = lVar16 + 2) {
        lVar1 = *(long *)((long)sms_tree->split + lVar16 * 4);
        fVar20 = log1pf((float)*(uint *)(lVar1 + 0x48));
        features[local_78 + lVar16] = fVar20;
        fVar20 = log1pf((float)*(uint *)(lVar1 + 0x4c));
        features[local_78 + lVar16 + 1] = fVar20;
      }
      local_78 = (ulong)((int)local_78 + 8);
    }
    if ((features_to_get & 4U) != 0) {
      for (lVar16 = 0; lVar16 != 8; lVar16 = lVar16 + 1) {
        fVar20 = log1pf((float)sms_tree->sms_rect_feat[lVar16]);
        features[local_78 + lVar16] = fVar20;
      }
      local_78 = (ulong)((int)local_78 + 8);
    }
    bVar19 = ((cpi->common).seq_params)->monochrome == '\0';
    uVar13 = bVar19 + 1 + (uint)bVar19;
    iVar8 = (cpi->common).mi_params.mi_stride;
    iVar7 = mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                [(cpi->common).mi_params.mi_alloc_bsize];
    iVar6 = mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                [(cpi->common).mi_params.mi_alloc_bsize];
    iVar10 = iVar8 * mi_row + mi_col;
    (cpi->common).mi_params.mi_grid_base[iVar10] =
         (cpi->common).mi_params.mi_alloc +
         ((cpi->common).mi_params.mi_alloc_stride * iVar7 + iVar6);
    (x->e_mbd).mi = (cpi->common).mi_params.mi_grid_base + iVar10;
    (x->e_mbd).tx_type_map = (cpi->common).mi_params.tx_type_map + iVar10;
    (x->e_mbd).tx_type_map_stride = iVar8;
    x->mbmi_ext_frame =
         (cpi->mbmi_ext_info).frame_base + (iVar7 * (cpi->mbmi_ext_info).stride + iVar6);
    lVar16 = 0;
    av1_setup_dst_planes
              ((x->e_mbd).plane,bsize,&((cpi->common).cur_frame)->buf,mi_row,mi_col,0,uVar13);
    iVar8 = (cpi->oxcf).border_in_pixels;
    iVar7 = 8 - (iVar8 + mi_row * 4);
    iVar6 = (local_50 + mi_row) * -4 + -8;
    if (iVar6 < iVar7) {
      iVar6 = iVar7;
    }
    (x->mv_limits).row_min = iVar6;
    iVar7 = (cpi->common).mi_params.mi_rows;
    iVar10 = iVar7 - mi_row;
    iVar6 = iVar10 * 4 + 8;
    iVar10 = iVar8 + (iVar10 - local_50) * 4 + -8;
    if (iVar10 < iVar6) {
      iVar6 = iVar10;
    }
    (x->mv_limits).row_max = iVar6;
    iVar10 = 8 - (iVar8 + mi_col * 4);
    uVar18 = (uint)bVar14;
    iVar6 = (uVar18 + mi_col) * -4 + -8;
    if (iVar6 < iVar10) {
      iVar6 = iVar10;
    }
    (x->mv_limits).col_min = iVar6;
    iVar10 = (cpi->common).mi_params.mi_cols;
    iVar11 = iVar10 - mi_col;
    iVar6 = iVar11 * 4 + 8;
    iVar8 = iVar8 + (iVar11 - uVar18) * 4 + -8;
    if (iVar8 < iVar6) {
      iVar6 = iVar8;
    }
    (x->mv_limits).col_max = iVar6;
    for (; (ulong)uVar13 * 0xa30 - lVar16 != 0; lVar16 = lVar16 + 0xa30) {
      bVar12 = (byte)((local_50 << 2) >>
                     (*(byte *)((long)(x->e_mbd).plane[0].pre + lVar16 + -0x28) & 0x1f));
      bVar14 = (byte)((uVar18 << 2) >>
                     (*(byte *)((long)(x->e_mbd).plane[0].pre + lVar16 + -0x2c) & 0x1f));
      if (bVar14 < 5) {
        bVar14 = 4;
      }
      *(byte *)((long)((x->e_mbd).plane[0].seg_iqmatrix + -1) + lVar16 + 0x90) = bVar14;
      if (bVar12 < 5) {
        bVar12 = 4;
      }
      *(byte *)((long)((x->e_mbd).plane[0].seg_iqmatrix + -1) + lVar16 + 0x91) = bVar12;
    }
    (x->e_mbd).mi_row = mi_row;
    (x->e_mbd).mi_col = mi_col;
    (x->e_mbd).mb_to_top_edge = mi_row * -0x20;
    (x->e_mbd).mb_to_bottom_edge = (iVar7 - (local_50 + mi_row)) * 0x20;
    (x->e_mbd).mb_to_left_edge = mi_col * -0x20;
    (x->e_mbd).mb_to_right_edge = (iVar10 - (uVar18 + mi_col)) * 0x20;
    av1_setup_src_planes(x,cpi->source,mi_row,mi_col,uVar13,bsize);
    iVar5 = av1_dc_quant_QTX(x->qindex,0,(x->e_mbd).bd);
    iVar8 = (int)iVar5 >> ((char)(x->e_mbd).bd - 8U & 0x1f);
    fVar20 = log1pf((float)(iVar8 * iVar8) * 0.00390625);
    lVar16 = (long)(int)local_78;
    features[lVar16] = fVar20;
    pMVar2 = (x->e_mbd).left_mbmi;
    pMVar3 = (x->e_mbd).above_mbmi;
    if (pMVar3 != (MB_MODE_INFO *)0x0) {
      bsize = pMVar3->bsize;
    }
    if (pMVar2 != (MB_MODE_INFO *)0x0) {
      uVar9 = (ulong)pMVar2->bsize;
    }
    fVar20 = 1.0;
    fVar21 = 1.0;
    if (pMVar3 == (MB_MODE_INFO *)0x0) {
      fVar21 = 0.0;
    }
    features[lVar16 + 1] = fVar21;
    features[lVar16 + 2] = (float)""[bsize];
    features[lVar16 + 3] = (float)""[bsize];
    if (pMVar2 == (MB_MODE_INFO *)0x0) {
      fVar20 = 0.0;
    }
    features[lVar16 + 4] = fVar20;
    features[lVar16 + 5] = (float)""[uVar9];
    features[lVar16 + 6] = (float)""[uVar9];
  }
  return;
}

Assistant:

static inline void simple_motion_search_prune_part_features(
    AV1_COMP *const cpi, MACROBLOCK *x, SIMPLE_MOTION_DATA_TREE *sms_tree,
    int mi_row, int mi_col, BLOCK_SIZE bsize, float *features,
    int features_to_get) {
  const int w_mi = mi_size_wide[bsize];
  const int h_mi = mi_size_high[bsize];
  assert(mi_size_wide[bsize] == mi_size_high[bsize]);
  assert(bsize >= BLOCK_8X8);
  assert(cpi->ref_frame_flags & av1_ref_frame_flag_list[LAST_FRAME] ||
         cpi->ref_frame_flags & av1_ref_frame_flag_list[ALTREF_FRAME]);

  // Setting up motion search
  const int ref_list[] = { cpi->rc.is_src_frame_alt_ref ? ALTREF_FRAME
                                                        : LAST_FRAME };
  const int num_refs = 1;
  const int use_subpixel = 1;

  // Doing whole block first to update the mv
  if (!sms_tree->sms_none_valid && features_to_get & FEATURE_SMS_NONE_FLAG) {
    simple_motion_search_get_best_ref(cpi, x, sms_tree, mi_row, mi_col, bsize,
                                      ref_list, num_refs, use_subpixel, 1,
                                      &sms_tree->sms_none_feat[0],
                                      &sms_tree->sms_none_feat[1]);
    sms_tree->sms_none_valid = 1;
  }

  // Split subblocks
  if (features_to_get & FEATURE_SMS_SPLIT_FLAG) {
    const BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_SPLIT);
    for (int r_idx = 0; r_idx < SUB_PARTITIONS_SPLIT; r_idx++) {
      const int sub_mi_col = mi_col + (r_idx & 1) * w_mi / 2;
      const int sub_mi_row = mi_row + (r_idx >> 1) * h_mi / 2;
      SIMPLE_MOTION_DATA_TREE *sub_tree = sms_tree->split[r_idx];

      if (!sub_tree->sms_none_valid) {
        simple_motion_search_get_best_ref(
            cpi, x, sub_tree, sub_mi_row, sub_mi_col, subsize, ref_list,
            num_refs, use_subpixel, 1, &sub_tree->sms_none_feat[0],
            &sub_tree->sms_none_feat[1]);
        sub_tree->sms_none_valid = 1;
      }
    }
  }

  // Rectangular subblocks
  if (!sms_tree->sms_rect_valid && features_to_get & FEATURE_SMS_RECT_FLAG) {
    // Horz subblock
    BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_HORZ);
    for (int r_idx = 0; r_idx < SUB_PARTITIONS_RECT; r_idx++) {
      const int sub_mi_col = mi_col + 0;
      const int sub_mi_row = mi_row + r_idx * h_mi / 2;

      simple_motion_search_get_best_ref(
          cpi, x, sms_tree, sub_mi_row, sub_mi_col, subsize, ref_list, num_refs,
          use_subpixel, 0, &sms_tree->sms_rect_feat[2 * r_idx],
          &sms_tree->sms_rect_feat[2 * r_idx + 1]);
    }

    // Vert subblock
    subsize = get_partition_subsize(bsize, PARTITION_VERT);
    for (int r_idx = 0; r_idx < SUB_PARTITIONS_RECT; r_idx++) {
      const int sub_mi_col = mi_col + r_idx * w_mi / 2;
      const int sub_mi_row = mi_row + 0;

      simple_motion_search_get_best_ref(
          cpi, x, sms_tree, sub_mi_row, sub_mi_col, subsize, ref_list, num_refs,
          use_subpixel, 0, &sms_tree->sms_rect_feat[4 + 2 * r_idx],
          &sms_tree->sms_rect_feat[4 + 2 * r_idx + 1]);
    }
    sms_tree->sms_rect_valid = 1;
  }

  if (!features) return;

  int f_idx = 0;
  if (features_to_get & FEATURE_SMS_NONE_FLAG) {
    for (int sub_idx = 0; sub_idx < 2; sub_idx++) {
      features[f_idx++] = log1pf((float)sms_tree->sms_none_feat[sub_idx]);
    }
  }

  if (features_to_get & FEATURE_SMS_SPLIT_FLAG) {
    for (int sub_idx = 0; sub_idx < SUB_PARTITIONS_SPLIT; sub_idx++) {
      SIMPLE_MOTION_DATA_TREE *sub_tree = sms_tree->split[sub_idx];
      features[f_idx++] = log1pf((float)sub_tree->sms_none_feat[0]);
      features[f_idx++] = log1pf((float)sub_tree->sms_none_feat[1]);
    }
  }

  if (features_to_get & FEATURE_SMS_RECT_FLAG) {
    for (int sub_idx = 0; sub_idx < 8; sub_idx++) {
      features[f_idx++] = log1pf((float)sms_tree->sms_rect_feat[sub_idx]);
    }
  }

  const MACROBLOCKD *xd = &x->e_mbd;
  set_offsets_for_motion_search(cpi, x, mi_row, mi_col, bsize);

  // Q_INDEX
  const int dc_q = av1_dc_quant_QTX(x->qindex, 0, xd->bd) >> (xd->bd - 8);
  features[f_idx++] = log1pf((float)(dc_q * dc_q) / 256.0f);

  // Neighbor stuff
  const int has_above = !!xd->above_mbmi;
  const int has_left = !!xd->left_mbmi;
  const BLOCK_SIZE above_bsize = has_above ? xd->above_mbmi->bsize : bsize;
  const BLOCK_SIZE left_bsize = has_left ? xd->left_mbmi->bsize : bsize;
  features[f_idx++] = (float)has_above;
  features[f_idx++] = (float)mi_size_wide_log2[above_bsize];
  features[f_idx++] = (float)mi_size_high_log2[above_bsize];
  features[f_idx++] = (float)has_left;
  features[f_idx++] = (float)mi_size_wide_log2[left_bsize];
  features[f_idx++] = (float)mi_size_high_log2[left_bsize];
}